

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

FxExpression * __thiscall
FxActionSpecialCall::Resolve(FxActionSpecialCall *this,FCompileContext *ctx)

{
  FxExpression *pFVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FxIntCast *this_00;
  FxNameCast *this_01;
  undefined4 extraout_var_01;
  ulong uVar4;
  char *message;
  bool bVar5;
  FCompileContext *size;
  ulong uVar6;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  pFVar1 = this->Self;
  if (pFVar1 != (FxExpression *)0x0) {
    iVar3 = (*pFVar1->_vptr_FxExpression[2])(pFVar1,ctx);
    this->Self = (FxExpression *)CONCAT44(extraout_var,iVar3);
    if ((FxExpression *)CONCAT44(extraout_var,iVar3) == (FxExpression *)0x0) goto LAB_0051621f;
  }
  bVar5 = false;
  for (uVar6 = 0; uVar6 < (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count;
      uVar6 = uVar6 + 1) {
    size = ctx;
    iVar3 = (*(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array[uVar6]->
              _vptr_FxExpression[2])();
    (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array[uVar6] =
         (FxExpression *)CONCAT44(extraout_var_00,iVar3);
    pFVar1 = (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array[uVar6];
    if (pFVar1 == (FxExpression *)0x0) {
LAB_0051620e:
      bVar5 = true;
    }
    else if ((uVar6 == 0) && (this->Special < 0)) {
      if (pFVar1->ValueType == (PType *)TypeString) {
        this_01 = (FxNameCast *)FxExpression::operator_new((FxExpression *)0x30,(size_t)size);
        FxNameCast::FxNameCast
                  (this_01,*(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array);
        *(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array =
             (FxExpression *)this_01;
        pFVar1 = *(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array;
        iVar3 = (*pFVar1->_vptr_FxExpression[2])(pFVar1,ctx);
        *(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array =
             (FxExpression *)CONCAT44(extraout_var_01,iVar3);
        bVar5 = (bool)(bVar5 | *(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array
                               == (FxExpression *)0x0);
      }
      else if (pFVar1->ValueType != (PType *)TypeName) {
        message = "Name expected for parameter %d";
        uVar4 = 0;
LAB_00516207:
        FScriptPosition::Message(&(this->super_FxExpression).ScriptPosition,2,message,uVar4);
        goto LAB_0051620e;
      }
    }
    else {
      bVar2 = FxExpression::IsInteger(pFVar1);
      if (!bVar2) {
        if ((this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array[uVar6]->ValueType->
            RegType != '\x01') {
          message = "Integer expected for parameter %d";
          uVar4 = uVar6 & 0xffffffff;
          goto LAB_00516207;
        }
        this_00 = (FxIntCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)size);
        FxIntCast::FxIntCast
                  (this_00,(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array[uVar6]
                   ,ctx->FromDecorate,false);
        (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array[uVar6] =
             (FxExpression *)this_00;
      }
    }
  }
  if (!bVar5) {
    (this->super_FxExpression).ValueType = (PType *)TypeSInt32;
    return &this->super_FxExpression;
  }
LAB_0051621f:
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  return (FxExpression *)0x0;
}

Assistant:

FxExpression *FxActionSpecialCall::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	bool failed = false;

	SAFE_RESOLVE_OPT(Self, ctx);
	for (unsigned i = 0; i < ArgList.Size(); i++)
	{
		ArgList[i] = ArgList[i]->Resolve(ctx);
		if (ArgList[i] == nullptr)
		{
			failed = true;
		}
		else if (Special < 0 && i == 0)
		{
			if (ArgList[i]->ValueType == TypeString)
			{
				ArgList[i] = new FxNameCast(ArgList[i]);
				ArgList[i] = ArgList[i]->Resolve(ctx);
				if (ArgList[i] == nullptr)
				{
					failed = true;
				}
			}
			else if (ArgList[i]->ValueType != TypeName)
			{
				ScriptPosition.Message(MSG_ERROR, "Name expected for parameter %d", i);
				failed = true;
			}
		}
		else if (!ArgList[i]->IsInteger())
		{
			if (ArgList[i]->ValueType->GetRegType() == REGT_FLOAT /* lax */)
			{
				ArgList[i] = new FxIntCast(ArgList[i], ctx.FromDecorate);
			}
			else
			{
				ScriptPosition.Message(MSG_ERROR, "Integer expected for parameter %d", i);
				failed = true;
			}
		}
	}
	if (failed)
	{
		delete this;
		return nullptr;
	}
	ValueType = TypeSInt32;
	return this;
}